

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkwrite.c
# Opt level: O0

int pk_write_ec_pubkey(uchar **p,uchar *start,mbedtls_ecp_keypair *ec)

{
  uchar local_c8 [8];
  uchar buf [133];
  size_t local_38;
  size_t len;
  mbedtls_ecp_keypair *pmStack_28;
  int ret;
  mbedtls_ecp_keypair *ec_local;
  uchar *start_local;
  uchar **p_local;
  
  local_38 = 0;
  pmStack_28 = ec;
  ec_local = (mbedtls_ecp_keypair *)start;
  start_local = (uchar *)p;
  len._4_4_ = mbedtls_ecp_point_write_binary(&ec->grp,&ec->Q,0,&local_38,local_c8,0x85);
  p_local._4_4_ = len._4_4_;
  if (len._4_4_ == 0) {
    if ((*(mbedtls_ecp_keypair **)start_local < ec_local) ||
       ((ulong)(*(long *)start_local - (long)ec_local) < local_38)) {
      p_local._4_4_ = -0x6c;
    }
    else {
      *(size_t *)start_local = *(long *)start_local - local_38;
      memcpy(*(void **)start_local,local_c8,local_38);
      p_local._4_4_ = (int)local_38;
    }
  }
  return p_local._4_4_;
}

Assistant:

static int pk_write_ec_pubkey( unsigned char **p, unsigned char *start,
                                 mbedtls_ecp_keypair *ec )
{
    int ret;
    size_t len = 0;
    unsigned char buf[MBEDTLS_ECP_MAX_PT_LEN];

    if( ( ret = mbedtls_ecp_point_write_binary( &ec->grp, &ec->Q,
                                        MBEDTLS_ECP_PF_UNCOMPRESSED,
                                        &len, buf, sizeof( buf ) ) ) != 0 )
    {
        return( ret );
    }

    if( *p < start || (size_t)( *p - start ) < len )
        return( MBEDTLS_ERR_ASN1_BUF_TOO_SMALL );

    *p -= len;
    memcpy( *p, buf, len );

    return( (int) len );
}